

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O0

void embree::destroyThread(thread_t tid)

{
  pthread_t *in_RDI;
  
  pthread_cancel(*in_RDI);
  if (in_RDI != (pthread_t *)0x0) {
    ::operator_delete(in_RDI);
  }
  return;
}

Assistant:

void destroyThread(thread_t tid) {
#if defined(__ANDROID__)
    FATAL("Can't destroy threads on Android."); // pthread_cancel not implemented.
#else
    pthread_cancel(*(pthread_t*)tid);
    delete (pthread_t*)tid;
#endif
  }